

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall
Args::Arg::Arg<std::__cxx11::string>
          (Arg *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
          bool isWithValue,bool isRequired)

{
  byte in_CL;
  byte in_DL;
  string *in_RSI;
  ArgIface *in_RDI;
  allocator local_13;
  byte local_12;
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_10 = in_RSI;
  ArgIface::ArgIface(in_RDI);
  in_RDI->_vptr_ArgIface = (_func_int **)&PTR__Arg_00175710;
  *(byte *)&in_RDI[1]._vptr_ArgIface = local_11 & 1;
  *(byte *)((long)&in_RDI[1]._vptr_ArgIface + 1) = local_12 & 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ArgIface + 2) = 0;
  std::__cxx11::string::string((string *)&in_RDI[1].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[3].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[5].m_cmdLine,local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[7].m_cmdLine,"arg",&local_13);
  std::allocator<char>::~allocator((allocator<char> *)&local_13);
  std::__cxx11::string::string((string *)&in_RDI[9].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[0xb].m_cmdLine);
  std::__cxx11::string::string((string *)&in_RDI[0xd].m_cmdLine);
  return;
}

Assistant:

Arg::Arg( T && name,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_name( std::forward< T > ( name ) )
	,	m_valueSpecifier( SL( "arg" ) )
{
}